

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
absl::lts_20240722::strings_internal::
Splitter<absl::lts_20240722::ByChar,absl::lts_20240722::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>
::
ConvertToPair<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,void *this)

{
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pSVar1;
  string_view second;
  string_view first;
  const_iterator it;
  size_t local_a8;
  char *pcStack_a0;
  size_t local_98;
  char *pcStack_90;
  const_iterator local_80;
  const_iterator local_50;
  
  local_98 = 0;
  pcStack_90 = (char *)0x0;
  local_a8 = 0;
  pcStack_a0 = (char *)0x0;
  Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::begin(&local_50,
          (Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *)this);
  Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::end(&local_80,
        (Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
         *)this);
  if ((local_50.state_ != local_80.state_) || (local_50.pos_ != local_80.pos_)) {
    local_98 = local_50.curr_._M_len;
    pcStack_90 = local_50.curr_._M_str;
    pSVar1 = SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator++(&local_50);
    Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::end(&local_80,
          (Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *)this);
    if ((pSVar1->state_ != local_80.state_) || (pSVar1->pos_ != local_80.pos_)) {
      local_a8 = local_50.curr_._M_len;
      pcStack_a0 = local_50.curr_._M_str;
    }
  }
  (__return_storage_ptr__->first)._M_len = local_98;
  (__return_storage_ptr__->first)._M_str = pcStack_90;
  (__return_storage_ptr__->second)._M_len = local_a8;
  (__return_storage_ptr__->second)._M_str = pcStack_a0;
  return __return_storage_ptr__;
}

Assistant:

std::pair<First, Second> ConvertToPair() const {
    absl::string_view first, second;
    auto it = begin();
    if (it != end()) {
      first = *it;
      if (++it != end()) {
        second = *it;
      }
    }
    return {First(first), Second(second)};
  }